

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O1

optional_idx
duckdb::ParquetMultiFileInfo::MaxThreads
          (MultiFileBindData *bind_data_p,MultiFileGlobalState *global_state,
          FileExpandResult expand_result)

{
  pointer puVar1;
  idx_t in_RAX;
  pointer pTVar2;
  undefined3 in_register_00000011;
  optional_idx local_8;
  
  if (CONCAT31(in_register_00000011,expand_result) == 2) {
    local_8.index = 0xffffffffffffffff;
  }
  else {
    local_8.index = in_RAX;
    pTVar2 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
             ::operator->(&bind_data_p->bind_data);
    puVar1 = pTVar2[1].column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    optional_idx::optional_idx(&local_8,(long)puVar1 + (ulong)(puVar1 == (pointer)0x0));
  }
  return (optional_idx)local_8.index;
}

Assistant:

optional_idx ParquetMultiFileInfo::MaxThreads(const MultiFileBindData &bind_data_p,
                                              const MultiFileGlobalState &global_state,
                                              FileExpandResult expand_result) {
	if (expand_result == FileExpandResult::MULTIPLE_FILES) {
		// always launch max threads if we are reading multiple files
		return optional_idx();
	}
	auto &bind_data = bind_data_p.bind_data->Cast<ParquetReadBindData>();
	return MaxValue(bind_data.initial_file_row_groups, static_cast<idx_t>(1));
}